

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-sys-linux.c
# Opt level: O3

void get_topology_cold_1(void)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  
  fprintf(_stderr,"%s [%s] ","[WARN] ","raplcap-msr");
  __stream = _stderr;
  piVar1 = __errno_location();
  pcVar2 = strerror(*piVar1);
  fprintf(__stream,"%s: %s\n","get_physical_package_id: fclose",pcVar2);
  return;
}

Assistant:

static int get_physical_package_id(uint32_t cpu, uint32_t* pkg) {
  char fname[92] = { 0 };
  FILE* f;
  int fret;
  snprintf(fname, sizeof(fname), "/sys/devices/system/cpu/cpu%"PRIu32"/topology/physical_package_id", cpu);
  if ((f = fopen(fname, "r")) == NULL) {
    raplcap_perror(ERROR, fname);
    return -1;
  }
  fret = fscanf(f, "%"PRIu32, pkg);
  if (fclose(f)) {
    raplcap_perror(WARN, "get_physical_package_id: fclose");
  }
  if (fret != 1) {
    raplcap_log(ERROR, "get_physical_package_id: Failed to read physical_package_id for cpu%"PRIu32"\n", cpu);
    errno = ENODATA;
    return -1;
  }
  raplcap_log(DEBUG, "get_physical_package_id: cpu=%"PRIu32", pkg=%"PRIu32"\n", cpu, *pkg);
  return 0;
}